

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gritlm.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  llama_token id;
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  llama_context *plVar5;
  undefined8 uVar6;
  llama_vocab *vocab;
  long lVar7;
  float fVar8;
  int8_t **ppiVar9;
  ulong uVar10;
  llama_model_params *plVar11;
  llama_context_params *plVar12;
  undefined8 *puVar13;
  uint uVar14;
  byte bVar15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<int> __l_01;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  q_rep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  documents;
  string instruction;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  queries;
  llama_batch bat;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  d_rep;
  llama_model_params mparams;
  llama_context_params cparams;
  common_params params;
  undefined4 local_15b8;
  undefined4 uStack_15b4;
  undefined4 uStack_15b0;
  undefined4 uStack_15ac;
  undefined4 local_15a8;
  undefined4 uStack_15a4;
  undefined4 uStack_15a0;
  undefined4 uStack_159c;
  undefined4 local_1598;
  undefined4 uStack_1594;
  undefined4 uStack_1590;
  undefined4 uStack_158c;
  int8_t *local_1588;
  float local_1534;
  float local_1530;
  allocator_type local_1529;
  string local_1528;
  vector<int,_std::allocator<int>_> local_1508;
  string local_14f0;
  undefined1 local_14d0 [17];
  undefined7 uStack_14bf;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_14b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_14a0;
  undefined8 local_1490;
  undefined4 uStack_1488;
  undefined4 uStack_1484;
  int8_t *local_1480 [3];
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_1468;
  float local_1450;
  float local_144c;
  llama_context *local_1448;
  undefined8 local_1440;
  llama_model_params local_1438;
  llama_context_params local_13f0;
  common_params local_1378;
  
  bVar15 = 0;
  common_params::common_params(&local_1378);
  bVar1 = common_params_parse(argc,argv,&local_1378,LLAMA_EXAMPLE_COMMON,
                              (_func_void_int_char_ptr_ptr *)0x0);
  iVar2 = 1;
  if (bVar1) {
    common_init();
    common_model_params_to_llama(&local_1438,&local_1378);
    common_context_params_to_llama(&local_13f0,&local_1378);
    llama_backend_init();
    plVar11 = &local_1438;
    puVar13 = (undefined8 *)&local_15b8;
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar13 = plVar11->devices;
      plVar11 = (llama_model_params *)((long)plVar11 + ((ulong)bVar15 * -2 + 1) * 8);
      puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
    }
    uVar4 = llama_model_load_from_file(local_1378.model.path._M_dataplus._M_p);
    plVar12 = &local_13f0;
    puVar13 = (undefined8 *)&local_15b8;
    for (lVar7 = 0xf; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar13 = *(undefined8 *)plVar12;
      plVar12 = (llama_context_params *)((long)plVar12 + ((ulong)bVar15 * -2 + 1) * 8);
      puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
    }
    plVar5 = (llama_context *)llama_init_from_model(uVar4);
    llama_sampler_chain_default_params();
    local_1480[2] = (int8_t *)llama_sampler_chain_init(0);
    uVar6 = llama_sampler_init_greedy();
    llama_sampler_chain_add(local_1480[2],uVar6);
    local_14f0._M_dataplus._M_p = (pointer)&local_14f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_14f0,
               "Given a scientific paper title, retrieve the paper\'s abstract","");
    local_14b0._M_allocated_capacity = (size_type)&local_14a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_14b0,"Bitcoin: A Peer-to-Peer Electronic Cash System","");
    ppiVar9 = local_1480;
    local_1490 = ppiVar9;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1490,"Generative Representational Instruction Tuning","");
    __l._M_len = 2;
    __l._M_array = (iterator)&local_14b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_14d0,__l,(allocator_type *)&local_1528);
    lVar7 = -0x40;
    do {
      if (ppiVar9 != (int8_t **)ppiVar9[-2]) {
        operator_delete(ppiVar9[-2],(ulong)(*ppiVar9 + 1));
      }
      ppiVar9 = ppiVar9 + -4;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0);
    local_14b0._M_allocated_capacity = (size_type)&local_14a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_14b0,
               "A purely peer-to-peer version of electronic cash would allow online payments to be sent directly from one party to another without going through a financial institution. Digital signatures provide part of the solution, but the main benefits are lost if a trusted third party is still required to prevent double-spending. We propose a solution to the double-spending problem using a peer-to-peer network. The network timestamps transactions by hashing them into an ongoing chain of hash-based proof-of-work, forming a record that cannot be changed without redoing the proof-of-work. The longest chain not only serves as proof of the sequence of events witnessed, but proof that it came from the largest pool of CPU power. As long as a majority of CPU power is controlled by nodes that are not cooperating to attack the network, they\'ll generate the longest chain and outpace attackers. The network itself requires minimal structure. Messages are broadcast on a best effort basis, and nodes can leave and rejoin the network at will, accepting the longest proof-of-work chain as proof of what happened while they were gone."
               ,"");
    ppiVar9 = local_1480;
    local_1490 = ppiVar9;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1490,
               "All text-based language problems can be reduced to either generation or embedding. Current models only perform well at one or the other. We introduce generative representational instruction tuning (GRIT) whereby a large language model is trained to handle both generative and embedding tasks by distinguishing between them through instructions. Compared to other open models, our resulting GritLM 7B sets a new state of the art on the Massive Text Embedding Benchmark (MTEB) and outperforms all models up to its size on a range of generative tasks. By scaling up further, GritLM 8X7B outperforms all open generative language models that we tried while still being among the best embedding models. Notably, we find that GRIT matches training on only generative or embedding data, thus we can unify both at no performance loss. Among other benefits, the unification via GRIT speeds up Retrieval-Augmented Generation (RAG) by > 60% for long documents, by no longer requiring separate retrieval and generation models. Models, code, etc. are freely available at https://github.com/ContextualAI/gritlm."
               ,"");
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)&local_14b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1508,__l_00,(allocator_type *)&local_1528);
    lVar7 = -0x40;
    do {
      if (ppiVar9 != (int8_t **)ppiVar9[-2]) {
        operator_delete(ppiVar9[-2],(ulong)(*ppiVar9 + 1));
      }
      ppiVar9 = ppiVar9 + -4;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0);
    local_1528._M_dataplus._M_p = (pointer)&local_1528.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1528,"");
    gritlm_instruction((string *)&local_14b0,&local_1528);
    encode(&local_1468,plVar5,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_1508,(string *)&local_14b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_14b0._M_allocated_capacity != &local_14a0) {
      operator_delete((void *)local_14b0._M_allocated_capacity,
                      CONCAT44(local_14a0._M_allocated_capacity._4_4_,
                               local_14a0._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1528._M_dataplus._M_p != &local_1528.field_2) {
      operator_delete(local_1528._M_dataplus._M_p,local_1528.field_2._M_allocated_capacity + 1);
    }
    gritlm_instruction((string *)&local_14b0,&local_14f0);
    encode((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)&local_1528,plVar5,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_14d0,(string *)&local_14b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_14b0._M_allocated_capacity != &local_14a0) {
      operator_delete((void *)local_14b0._M_allocated_capacity,
                      CONCAT44(local_14a0._M_allocated_capacity._4_4_,
                               local_14a0._M_allocated_capacity._0_4_) + 1);
    }
    iVar2 = llama_model_n_embd(uVar4);
    local_1530 = common_embd_similarity_cos
                           (*(float **)local_1528._M_dataplus._M_p,
                            *(float **)
                             CONCAT44(local_1468.
                                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (int)local_1468.
                                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start),iVar2);
    local_1534 = common_embd_similarity_cos
                           (*(float **)local_1528._M_dataplus._M_p,
                            *(float **)
                             (CONCAT44(local_1468.
                                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)local_1468.
                                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start) + 0x18),iVar2
                           );
    local_144c = common_embd_similarity_cos
                           (*(float **)(local_1528._M_dataplus._M_p + 0x18),
                            *(float **)
                             CONCAT44(local_1468.
                                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (int)local_1468.
                                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start),iVar2);
    local_1448 = plVar5;
    local_1450 = common_embd_similarity_cos
                           (*(float **)(local_1528._M_dataplus._M_p + 0x18),
                            *(float **)
                             (CONCAT44(local_1468.
                                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)local_1468.
                                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start) + 0x18),iVar2
                           );
    printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n",
           SUB84((double)local_1530,0),((_Alloc_hider *)local_14d0._0_8_)->_M_p,
           *(undefined8 *)
            local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start);
    printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n",
           SUB84((double)local_1534,0),((_Alloc_hider *)local_14d0._0_8_)->_M_p,
           *(undefined8 *)
            (local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + 8));
    printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n",
           SUB84((double)local_144c,0),(((pointer)(local_14d0._0_8_ + 0x20))->_M_dataplus)._M_p,
           *(undefined8 *)
            local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start);
    printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n",
           SUB84((double)local_1450,0),(((pointer)(local_14d0._0_8_ + 0x20))->_M_dataplus)._M_p,
           *(undefined8 *)
            (local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + 8));
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)&local_1528);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&local_1468);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1508);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_14d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_14f0._M_dataplus._M_p != &local_14f0.field_2) {
      operator_delete(local_14f0._M_dataplus._M_p,local_14f0.field_2._M_allocated_capacity + 1);
    }
    local_1528._M_dataplus._M_p = (pointer)&local_1528.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1528,
               "<|user|>\nPlease write me a poem about my recent hike of Mt. Fuji at midnight in the style of Shakespeare.\n<|assistant|>\n"
               ,"");
    plVar5 = local_1448;
    local_14d0._0_8_ = local_14d0 + 0x10;
    local_14d0._8_8_ = (pointer)0x0;
    local_14d0[0x10] = 0;
    uVar6 = llama_get_model(local_1448);
    vocab = (llama_vocab *)llama_model_get_vocab(uVar6);
    local_1534 = (float)llama_vocab_eos(vocab);
    llama_kv_self_clear(plVar5);
    llama_set_embeddings(plVar5,0);
    llama_set_causal_attn(plVar5,1);
    uVar3 = llama_n_batch(plVar5);
    llama_batch_init(&local_14b0,uVar3,0);
    common_tokenize(&local_1508,vocab,&local_1528,false,true);
    fVar8 = 0.0;
    local_1440 = uVar4;
    while( true ) {
      common_batch_clear((llama_batch *)&local_14b0);
      uVar14 = (uint)((ulong)((long)local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_finish -
                             (long)local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2);
      if (0 < (int)uVar14) {
        uVar10 = 0;
        local_1530 = fVar8;
        do {
          id = local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar10];
          local_1468.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)&local_1468;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_14f0,__l_01,&local_1529);
          common_batch_add((llama_batch *)&local_14b0,id,(int)fVar8 + (int)uVar10,
                           (vector<int,_std::allocator<int>_> *)&local_14f0,uVar14 - 1 == uVar10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_14f0._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_14f0._M_dataplus._M_p,
                            local_14f0.field_2._M_allocated_capacity -
                            (long)local_14f0._M_dataplus._M_p);
          }
          uVar10 = uVar10 + 1;
        } while ((uVar14 & 0x7fffffff) != uVar10);
        fVar8 = (float)((int)local_1530 + (int)uVar10);
        uVar4 = local_1440;
        plVar5 = local_1448;
      }
      if (local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      local_1588 = local_1480[0];
      local_1598 = (undefined4)local_1490;
      uStack_1594 = local_1490._4_4_;
      uStack_1590 = uStack_1488;
      uStack_158c = uStack_1484;
      local_15a8 = local_14a0._M_allocated_capacity._0_4_;
      uStack_15a4 = local_14a0._M_allocated_capacity._4_4_;
      uStack_15a0 = local_14a0._8_4_;
      uStack_159c = local_14a0._12_4_;
      local_15b8 = local_14b0._M_allocated_capacity._0_4_;
      uStack_15b4 = local_14b0._M_allocated_capacity._4_4_;
      uStack_15b0 = local_14b0._8_4_;
      uStack_15ac = local_14b0._12_4_;
      llama_decode(plVar5);
      local_1468.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           llama_sampler_sample(local_1480[2],plVar5,local_14b0._M_allocated_capacity._0_4_ + -1);
      if ((float)(int)local_1468.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start == local_1534) break;
      common_token_to_piece_abi_cxx11_
                (&local_14f0,plVar5,
                 (int)local_1468.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,true);
      printf("%s",local_14f0._M_dataplus._M_p);
      fflush(_stdout);
      if (local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_1508,
                   (iterator)
                   local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_1468);
      }
      else {
        *local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = (int)local_1468.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      std::__cxx11::string::_M_append(local_14d0,(ulong)local_14f0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_14f0._M_dataplus._M_p != &local_14f0.field_2) {
        operator_delete(local_14f0._M_dataplus._M_p,local_14f0.field_2._M_allocated_capacity + 1);
      }
    }
    putchar(10);
    local_1588 = local_1480[0];
    local_1598 = (undefined4)local_1490;
    uStack_1594 = local_1490._4_4_;
    uStack_1590 = uStack_1488;
    uStack_158c = uStack_1484;
    local_15a8 = local_14a0._M_allocated_capacity._0_4_;
    uStack_15a4 = local_14a0._M_allocated_capacity._4_4_;
    uStack_15a0 = local_14a0._8_4_;
    uStack_159c = local_14a0._12_4_;
    local_15b8 = local_14b0._M_allocated_capacity._0_4_;
    uStack_15b4 = local_14b0._M_allocated_capacity._4_4_;
    uStack_15b0 = local_14b0._8_4_;
    uStack_15ac = local_14b0._12_4_;
    llama_batch_free();
    if (local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1508.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((pointer)local_14d0._0_8_ != (pointer)(local_14d0 + 0x10)) {
      operator_delete((void *)local_14d0._0_8_,CONCAT71(uStack_14bf,local_14d0[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1528._M_dataplus._M_p != &local_1528.field_2) {
      operator_delete(local_1528._M_dataplus._M_p,local_1528.field_2._M_allocated_capacity + 1);
    }
    llama_sampler_free(local_1480[2]);
    llama_free(plVar5);
    llama_model_free(uVar4);
    llama_backend_free();
    iVar2 = 0;
  }
  common_params::~common_params(&local_1378);
  return iVar2;
}

Assistant:

int main(int argc, char * argv[]) {
    common_params params;

    if (!common_params_parse(argc, argv, params, LLAMA_EXAMPLE_COMMON)) {
        return 1;
    }

    common_init();

    llama_model_params mparams = common_model_params_to_llama(params);
    llama_context_params cparams = common_context_params_to_llama(params);

    llama_backend_init();

    llama_model * model = llama_model_load_from_file(params.model.path.c_str(), mparams);

    // create generation context
    llama_context * ctx = llama_init_from_model(model, cparams);

    auto sparams = llama_sampler_chain_default_params();

    sparams.no_perf = false;

    llama_sampler * smpl = llama_sampler_chain_init(sparams);

    llama_sampler_chain_add(smpl, llama_sampler_init_greedy());

    // ### Embedding/Representation ###
    // samples taken from: https://github.com/ContextualAI/gritlm#basic
    {
        const std::string instruction = "Given a scientific paper title, retrieve the paper's abstract";

        const std::vector<std::string> queries = {
            "Bitcoin: A Peer-to-Peer Electronic Cash System",
            "Generative Representational Instruction Tuning",
        };

        const std::vector<std::string> documents = {
            "A purely peer-to-peer version of electronic cash would allow online payments to be sent directly from one party to another without going through a financial institution. Digital signatures provide part of the solution, but the main benefits are lost if a trusted third party is still required to prevent double-spending. We propose a solution to the double-spending problem using a peer-to-peer network. The network timestamps transactions by hashing them into an ongoing chain of hash-based proof-of-work, forming a record that cannot be changed without redoing the proof-of-work. The longest chain not only serves as proof of the sequence of events witnessed, but proof that it came from the largest pool of CPU power. As long as a majority of CPU power is controlled by nodes that are not cooperating to attack the network, they'll generate the longest chain and outpace attackers. The network itself requires minimal structure. Messages are broadcast on a best effort basis, and nodes can leave and rejoin the network at will, accepting the longest proof-of-work chain as proof of what happened while they were gone.",
            "All text-based language problems can be reduced to either generation or embedding. Current models only perform well at one or the other. We introduce generative representational instruction tuning (GRIT) whereby a large language model is trained to handle both generative and embedding tasks by distinguishing between them through instructions. Compared to other open models, our resulting GritLM 7B sets a new state of the art on the Massive Text Embedding Benchmark (MTEB) and outperforms all models up to its size on a range of generative tasks. By scaling up further, GritLM 8X7B outperforms all open generative language models that we tried while still being among the best embedding models. Notably, we find that GRIT matches training on only generative or embedding data, thus we can unify both at no performance loss. Among other benefits, the unification via GRIT speeds up Retrieval-Augmented Generation (RAG) by > 60% for long documents, by no longer requiring separate retrieval and generation models. Models, code, etc. are freely available at https://github.com/ContextualAI/gritlm.",
        };

        // No need to add instruction for retrieval documents
        const std::vector<std::vector<float>> d_rep = encode(ctx, documents, gritlm_instruction(""));
        const std::vector<std::vector<float>> q_rep = encode(ctx, queries,   gritlm_instruction(instruction));

        const int n_embd = llama_model_n_embd(model);

        const float cosine_sim_q0_d0 = common_embd_similarity_cos(q_rep[0].data(), d_rep[0].data(), n_embd);
        const float cosine_sim_q0_d1 = common_embd_similarity_cos(q_rep[0].data(), d_rep[1].data(), n_embd);
        const float cosine_sim_q1_d0 = common_embd_similarity_cos(q_rep[1].data(), d_rep[0].data(), n_embd);
        const float cosine_sim_q1_d1 = common_embd_similarity_cos(q_rep[1].data(), d_rep[1].data(), n_embd);

        std::printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n", queries[0].c_str(), documents[0].c_str(), cosine_sim_q0_d0);
        std::printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n", queries[0].c_str(), documents[1].c_str(), cosine_sim_q0_d1);
        std::printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n", queries[1].c_str(), documents[0].c_str(), cosine_sim_q1_d0);
        std::printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n", queries[1].c_str(), documents[1].c_str(), cosine_sim_q1_d1);
    }

    // ### Generation ###
    // GritLM models are not finetuned with system prompts, as you can just include system-like instructions together with your user instruction
    {
        const std::string prompt = "<|user|>\nPlease write me a poem about my recent hike of Mt. Fuji at midnight in the style of Shakespeare.\n<|assistant|>\n";
        std::string response = generate(ctx, smpl, prompt, true);
    }

    llama_sampler_free(smpl);
    llama_free(ctx);
    llama_model_free(model);
    llama_backend_free();

    return 0;
}